

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ball.cpp
# Opt level: O3

void __thiscall Ball::draw(Ball *this,Graphics *g)

{
  _Map_pointer ppvVar1;
  _Elt_pointer pvVar2;
  uint __val;
  uint uVar3;
  int iVar4;
  vec<2,_float,_(glm::qualifier)0> *pvVar5;
  uint uVar6;
  vec<2,_float,_(glm::qualifier)0> *pvVar7;
  ulong uVar8;
  ulong uVar9;
  int i;
  uint __len;
  long lVar10;
  uint uVar11;
  long lVar12;
  undefined4 uVar13;
  float fVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  vec4 color;
  vec4 color_00;
  vec4 color_01;
  string __str;
  string local_68;
  undefined4 local_48;
  float fStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  piksel::Graphics::push(g);
  iVar4 = piksel::Graphics::millis(g);
  iVar4 = piksel::Timer::getElapsedTimeInMillis(&this->respawnTimer,iVar4);
  if (iVar4 < 3000) {
    color.field_0._8_8_ = 0x3f8000003f800000;
    color.field_0._0_8_ = 0x3f8000003f800000;
    piksel::Graphics::fill(g,color);
    piksel::Graphics::textSize(g,16.0);
    iVar4 = piksel::Graphics::millis(g);
    iVar4 = piksel::Timer::getElapsedTimeInMillis(&this->respawnTimer,iVar4);
    iVar4 = (int)((ulong)((long)iVar4 * -0x10624dd3) >> 0x20);
    uVar11 = ((iVar4 >> 6) - (iVar4 >> 0x1f)) + 3;
    __val = -uVar11;
    if (0 < (int)uVar11) {
      __val = uVar11;
    }
    __len = 1;
    if (9 < __val) {
      uVar8 = (ulong)__val;
      uVar3 = 4;
      do {
        __len = uVar3;
        uVar6 = (uint)uVar8;
        if (uVar6 < 100) {
          __len = __len - 2;
          goto LAB_0012d02e;
        }
        if (uVar6 < 1000) {
          __len = __len - 1;
          goto LAB_0012d02e;
        }
        if (uVar6 < 10000) goto LAB_0012d02e;
        uVar8 = uVar8 / 10000;
        uVar3 = __len + 4;
      } while (99999 < uVar6);
      __len = __len + 1;
    }
LAB_0012d02e:
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_68,(char)__len - (char)((int)uVar11 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_68._M_dataplus._M_p + (uVar11 >> 0x1f),__len,__val);
    piksel::Graphics::text
              (g,&local_68,
               (this->velocity).field_0.field_0.x * 4.0 +
               (this->super_AABB).center.field_0.field_0.x + -4.0,
               (this->velocity).field_0.field_0.y * 4.0 +
               (this->super_AABB).center.field_0.field_0.y + 8.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
  piksel::Graphics::rectMode(g,RADIUS);
  piksel::Graphics::noStroke(g);
  color_00.field_0._8_8_ = 0x3f8000003e969697;
  color_00.field_0._0_8_ = 0x3e9292933f46c6c7;
  piksel::Graphics::fill(g,color_00);
  piksel::Graphics::rect
            (g,(this->super_AABB).center.field_0.field_0.x,
             (this->super_AABB).center.field_0.field_0.y,
             (this->super_AABB).halfDimension.field_0.field_0.x,
             (this->super_AABB).halfDimension.field_0.field_0.y);
  lVar12 = 0;
  lVar10 = 0;
  uVar13 = 0x3e969697;
  fVar14 = 1.0;
  uVar15 = 0;
  uVar16 = 0;
  do {
    ppvVar1 = (this->prevCenters).
              super__Deque_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    iVar4 = (int)((ulong)((long)(this->prevCenters).
                                super__Deque_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_last -
                         (long)(this->prevCenters).
                               super__Deque_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) +
            (int)((ulong)((long)(this->prevCenters).
                                super__Deque_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                         (long)(this->prevCenters).
                               super__Deque_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) +
            ((((uint)((int)ppvVar1 -
                     *(int *)&(this->prevCenters).
                              super__Deque_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
            (uint)(ppvVar1 == (_Map_pointer)0x0)) * 0x40;
    if (5 < iVar4) {
      iVar4 = 6;
    }
    if (iVar4 <= lVar10) {
      piksel::Graphics::pop(g);
      return;
    }
    fStack_44 = fVar14 + -0.15;
    color_01.field_0.field_0.w = fStack_44;
    color_01.field_0.field_0.z = (float)uVar13;
    color_01.field_0._0_8_ = 0x3e9292933f46c6c7;
    local_48 = uVar13;
    uStack_40 = uVar15;
    uStack_3c = uVar16;
    piksel::Graphics::fill(g,color_01);
    pvVar2 = (this->prevCenters).
             super__Deque_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    uVar8 = ((long)pvVar2 -
             (long)(this->prevCenters).
                   super__Deque_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_first >> 3) + lVar10;
    if ((long)uVar8 < 0) {
      uVar9 = (long)uVar8 >> 6;
LAB_0012d1b8:
      pvVar5 = (this->prevCenters).
               super__Deque_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node[uVar9];
      pvVar7 = pvVar5 + ((uint)uVar8 & 0x3f);
      pvVar5 = pvVar5 + uVar8 + uVar9 * -0x40;
    }
    else {
      if (0x3f < uVar8) {
        uVar9 = uVar8 >> 6;
        goto LAB_0012d1b8;
      }
      pvVar5 = (vec<2,_float,_(glm::qualifier)0> *)((long)&pvVar2->field_0 + lVar12);
      pvVar7 = pvVar5;
    }
    piksel::Graphics::rect
              (g,(pvVar7->field_0).field_0.x,(pvVar5->field_0).field_0.y,
               (this->super_AABB).halfDimension.field_0.field_0.x,
               (this->super_AABB).halfDimension.field_0.field_0.y);
    lVar10 = lVar10 + 1;
    lVar12 = lVar12 + 8;
    uVar13 = local_48;
    fVar14 = fStack_44;
    uVar15 = uStack_40;
    uVar16 = uStack_3c;
  } while( true );
}

Assistant:

void Ball::draw(piksel::Graphics& g) {
    g.push();
    if (respawnTimer.getElapsedTimeInMillis(g.millis()) < 3000) {
        g.fill(WHITE);
        g.textSize(16);
        g.text(std::to_string(3 - respawnTimer.getElapsedTimeInMillis(g.millis()) / 1000), center.x + 4.0f * velocity.x - 4.0f, center.y + 4.0f * velocity.y + 8.0f);
    }
    g.rectMode(piksel::DrawMode::RADIUS);
    g.noStroke();
    glm::vec4 color = RED;
    g.fill(color);
    g.rect(center.x, center.y, halfDimension.x, halfDimension.y);
    for (int i = 0; i < std::min<int>(prevCenters.size(), 6); i++) {
        color.a -= 0.15f;
        g.fill(color);
        g.rect(prevCenters[i].x, prevCenters[i].y, halfDimension.x, halfDimension.y);
    }
    g.pop();
}